

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::ShaderDepthRangeTest::iterate(ShaderDepthRangeTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  IterateResult IVar2;
  undefined4 extraout_var;
  DepthRangeParams local_1b8 [4];
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  local_1b8[0].zNear = 0.0;
  local_1b8[0].zFar = 1.0;
  local_1b8[1].zNear = 1.5;
  local_1b8[1].zFar = -1.0;
  local_1b8[2].zNear = 0.7;
  local_1b8[2].zFar = 0.3;
  this->m_depthRange = local_1b8[this->m_iterNdx];
  local_198._0_8_ = ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"glDepthRangef(",0xe);
  std::ostream::_M_insert<double>((double)(this->m_depthRange).zNear);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)(this->m_depthRange).zFar);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x4d8))
            ((this->m_depthRange).zNear,(this->m_depthRange).zFar);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glDepthRangef()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x10c);
  deqp::gls::ShaderRenderCase::iterate(&this->super_ShaderRenderCase);
  iVar1 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar1;
  IVar2 = STOP;
  if (iVar1 != 3) {
    IVar2 = (IterateResult)
            (((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult
            == QP_TEST_RESULT_PASS);
  }
  return IVar2;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions& gl = m_renderCtx.getFunctions();

		const DepthRangeParams cases[] =
		{
			DepthRangeParams(0.0f,  1.0f),
			DepthRangeParams(1.5f, -1.0f),
			DepthRangeParams(0.7f,  0.3f)
		};

		m_depthRange = cases[m_iterNdx];
		m_testCtx.getLog() << tcu::TestLog::Message << "glDepthRangef(" << m_depthRange.zNear << ", " << m_depthRange.zFar << ")" << tcu::TestLog::EndMessage;
		gl.depthRangef(m_depthRange.zNear, m_depthRange.zFar);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthRangef()");

		gls::ShaderRenderCase::iterate();
		m_iterNdx += 1;

		if (m_iterNdx == DE_LENGTH_OF_ARRAY(cases) || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS)
			return STOP;
		else
			return CONTINUE;
	}